

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Id_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
      *this)

{
  Position *this_00;
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  eval_error *peVar4;
  byte *pbVar5;
  byte *pbVar6;
  allocator<char> local_41;
  File_Position local_40;
  string local_38;
  
  pbVar5 = (byte *)(this->m_position).m_pos;
  pbVar6 = (byte *)(this->m_position).m_end;
  if (pbVar5 != pbVar6) {
    this_00 = &this->m_position;
    if (m_alphabet._M_elems[8]._M_elems[*pbVar5] == true) {
      while( true ) {
        if (pbVar5 == pbVar6) {
          return true;
        }
        if (m_alphabet._M_elems[1]._M_elems[*pbVar5] != true) break;
        Position::operator++(this_00);
        pbVar5 = (byte *)(this->m_position).m_pos;
        pbVar6 = (byte *)(this->m_position).m_end;
      }
      return true;
    }
    if (*pbVar5 == 0x60) {
      Position::operator++(this_00);
      pcVar1 = (this->m_position).m_pos;
      pcVar3 = pcVar1;
      do {
        if (pcVar3 == (this->m_position).m_end) {
          if (pcVar1 != pcVar3) {
            peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"Incomplete identifier literal",&local_41);
            local_40.line = (this->m_position).line;
            local_40.column = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar4,&local_38,&local_40,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
LAB_0055f01b:
          peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"Missing contents of identifier literal",&local_41);
          local_40.line = (this->m_position).line;
          local_40.column = (this->m_position).col;
          exception::eval_error::eval_error
                    (peVar4,&local_38,&local_40,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        if (*pcVar3 == '`') {
          if (pcVar1 != pcVar3) {
            Position::operator++(this_00);
            return true;
          }
          goto LAB_0055f01b;
        }
        bVar2 = Eol(this);
        if (bVar2) {
          peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"Carriage return in identifier literal",&local_41);
          local_40.line = (this->m_position).line;
          local_40.column = (this->m_position).col;
          exception::eval_error::eval_error
                    (peVar4,&local_38,&local_40,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        Position::operator++(this_00);
        pcVar3 = (this->m_position).m_pos;
      } while( true );
    }
  }
  return false;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }